

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  UdpOutputPortDeclSyntax *pUVar1;
  DeepCloneVisitor visitor;
  EqualsValueClauseSyntax *local_50;
  Token local_48;
  Token local_38;
  Token local_28;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_28 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  local_38 = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  local_48 = parsing::Token::deepClone((Token *)(__fn + 0x70),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x80) == (SyntaxNode *)0x0) {
    local_50 = (EqualsValueClauseSyntax *)0x0;
  }
  else {
    local_50 = (EqualsValueClauseSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x80),(DeepCloneVisitor *)&local_50,
                          (BumpAllocator *)__child_stack);
  }
  pUVar1 = BumpAllocator::
           emplace<slang::syntax::UdpOutputPortDeclSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::EqualsValueClauseSyntax*>
                     ((BumpAllocator *)__child_stack,args,&local_28,&local_38,&local_48,&local_50);
  return (int)pUVar1;
}

Assistant:

static SyntaxNode* clone(const UdpOutputPortDeclSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<UdpOutputPortDeclSyntax>(
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        node.reg.deepClone(alloc),
        node.name.deepClone(alloc),
        node.initializer ? deepClone(*node.initializer, alloc) : nullptr
    );
}